

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O2

void blake2b_transform(BLAKE2B_CTX *b2b,uint8_t *block,size_t num_bytes,int is_final_block)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint64_t v [16];
  
  v[6] = b2b->h[6];
  v[7] = b2b->h[7];
  v[4] = b2b->h[4];
  v[5] = b2b->h[5];
  v[2] = b2b->h[2];
  v[3] = b2b->h[3];
  v[0] = b2b->h[0];
  v[1] = b2b->h[1];
  v[8] = 0x6a09e667f3bcc908;
  v[9] = 0xbb67ae8584caa73b;
  v[10] = 0x3c6ef372fe94f82b;
  v[0xb] = 0xa54ff53a5f1d36f1;
  v[0xe] = 0x1f83d9abfb41bd6b;
  v[0xf] = 0x5be0cd19137e2179;
  uVar2 = b2b->t_low;
  uVar5 = num_bytes + b2b->t_low;
  b2b->t_low = uVar5;
  uVar1 = b2b->t_high;
  if (CARRY8(num_bytes,uVar2)) {
    uVar1 = uVar1 + 1;
    b2b->t_high = uVar1;
  }
  v[0xc] = uVar5 ^ 0x510e527fade682d1;
  v[0xd] = uVar1 ^ 0x9b05688c2b3e6c1f;
  if (is_final_block != 0) {
    v[0xe] = 0xe07c265404be4294;
  }
  uVar2 = 0;
  for (uVar4 = 0; uVar4 != 0xc; uVar4 = uVar4 + 1) {
    uVar1 = (ulong)((int)uVar2 - 0xa0);
    if (uVar4 < 10) {
      uVar1 = uVar2;
    }
    blake2b_mix(v,0,4,8,0xc,*(uint64_t *)(block + (ulong)""[uVar1] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 1] * 8));
    blake2b_mix(v,1,5,9,0xd,*(uint64_t *)(block + (ulong)""[uVar1 + 2] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 3] * 8));
    blake2b_mix(v,2,6,10,0xe,*(uint64_t *)(block + (ulong)""[uVar1 + 4] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 5] * 8));
    blake2b_mix(v,3,7,0xb,0xf,*(uint64_t *)(block + (ulong)""[uVar1 + 6] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 7] * 8));
    blake2b_mix(v,0,5,10,0xf,*(uint64_t *)(block + (ulong)""[uVar1 + 8] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 9] * 8));
    blake2b_mix(v,1,6,0xb,0xc,*(uint64_t *)(block + (ulong)""[uVar1 + 10] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 0xb] * 8));
    blake2b_mix(v,2,7,8,0xd,*(uint64_t *)(block + (ulong)""[uVar1 + 0xc] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 0xd] * 8));
    blake2b_mix(v,3,4,9,0xe,*(uint64_t *)(block + (ulong)""[uVar1 + 0xe] * 8),
                *(uint64_t *)(block + (ulong)""[uVar1 + 0xf] * 8));
    uVar2 = (ulong)((int)uVar2 + 0x10);
  }
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    b2b->h[lVar3] = b2b->h[lVar3] ^ v[lVar3] ^ v[lVar3 + 8];
  }
  return;
}

Assistant:

static void blake2b_transform(BLAKE2B_CTX *b2b,
                              const uint8_t block[BLAKE2B_CBLOCK],
                              size_t num_bytes, int is_final_block) {
  // https://tools.ietf.org/html/rfc7693#section-3.2
  uint64_t v[16];
  static_assert(sizeof(v) == sizeof(b2b->h) + sizeof(kIV), "");
  OPENSSL_memcpy(v, b2b->h, sizeof(b2b->h));
  OPENSSL_memcpy(&v[8], kIV, sizeof(kIV));

  b2b->t_low += num_bytes;
  if (b2b->t_low < num_bytes) {
    b2b->t_high++;
  }
  v[12] ^= b2b->t_low;
  v[13] ^= b2b->t_high;

  if (is_final_block) {
    v[14] = ~v[14];
  }

  for (int round = 0; round < 12; round++) {
    const uint8_t *const s = &kSigma[16 * (round % 10)];
    blake2b_mix(v, 0, 4, 8, 12, blake2b_load(block, s[0]),
                blake2b_load(block, s[1]));
    blake2b_mix(v, 1, 5, 9, 13, blake2b_load(block, s[2]),
                blake2b_load(block, s[3]));
    blake2b_mix(v, 2, 6, 10, 14, blake2b_load(block, s[4]),
                blake2b_load(block, s[5]));
    blake2b_mix(v, 3, 7, 11, 15, blake2b_load(block, s[6]),
                blake2b_load(block, s[7]));
    blake2b_mix(v, 0, 5, 10, 15, blake2b_load(block, s[8]),
                blake2b_load(block, s[9]));
    blake2b_mix(v, 1, 6, 11, 12, blake2b_load(block, s[10]),
                blake2b_load(block, s[11]));
    blake2b_mix(v, 2, 7, 8, 13, blake2b_load(block, s[12]),
                blake2b_load(block, s[13]));
    blake2b_mix(v, 3, 4, 9, 14, blake2b_load(block, s[14]),
                blake2b_load(block, s[15]));
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(b2b->h); i++) {
    b2b->h[i] ^= v[i];
    b2b->h[i] ^= v[i + 8];
  }
}